

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * google::protobuf::internal::
       FieldParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                 (uint64_t tag,UnknownFieldLiteParserHelper *field_parser,char *ptr,
                 ParseContext *ctx)

{
  uint value_00;
  LogMessage *other;
  LogFinisher local_8d;
  uint32_t value_2;
  LogMessage local_80;
  unsigned_long local_48;
  uint64_t value_1;
  uint64_t value;
  ParseContext *pPStack_30;
  uint32_t number;
  ParseContext *ctx_local;
  char *ptr_local;
  UnknownFieldLiteParserHelper *field_parser_local;
  uint64_t tag_local;
  
  value._4_4_ = (uint32_t)(tag >> 3);
  if (value._4_4_ == 0) {
    tag_local = 0;
  }
  else {
    pPStack_30 = ctx;
    ctx_local = (ParseContext *)ptr;
    ptr_local = (char *)field_parser;
    field_parser_local = (UnknownFieldLiteParserHelper *)tag;
    switch((uint)tag & 7) {
    case 0:
      ctx_local = (ParseContext *)VarintParse<unsigned_long>(ptr,&value_1);
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)0x0;
      }
      UnknownFieldLiteParserHelper::AddVarint
                ((UnknownFieldLiteParserHelper *)ptr_local,value._4_4_,value_1);
      break;
    case 1:
      local_48 = UnalignedLoad<unsigned_long>(ptr);
      ctx_local = (ParseContext *)&(ctx_local->super_EpsCopyInputStream).buffer_end_;
      UnknownFieldLiteParserHelper::AddFixed64
                ((UnknownFieldLiteParserHelper *)ptr_local,value._4_4_,local_48);
      break;
    case 2:
      ctx_local = (ParseContext *)
                  UnknownFieldLiteParserHelper::ParseLengthDelimited
                            (field_parser,value._4_4_,ptr,ctx);
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)0x0;
      }
      break;
    case 3:
      ctx_local = (ParseContext *)
                  UnknownFieldLiteParserHelper::ParseGroup(field_parser,value._4_4_,ptr,ctx);
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)0x0;
      }
      break;
    case 4:
      LogMessage::LogMessage
                (&local_80,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.h"
                 ,0x339);
      other = LogMessage::operator<<(&local_80,"Can\'t happen");
      LogFinisher::operator=(&local_8d,other);
      LogMessage::~LogMessage(&local_80);
      break;
    case 5:
      value_00 = UnalignedLoad<unsigned_int>(ptr);
      ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 4);
      UnknownFieldLiteParserHelper::AddFixed32
                ((UnknownFieldLiteParserHelper *)ptr_local,value._4_4_,value_00);
      break;
    default:
      return (char *)0x0;
    }
    tag_local = (uint64_t)ctx_local;
  }
  return (char *)tag_local;
}

Assistant:

PROTOBUF_NODISCARD const char* FieldParser(uint64_t tag, T& field_parser,
                                           const char* ptr, ParseContext* ctx) {
  uint32_t number = tag >> 3;
  GOOGLE_PROTOBUF_PARSER_ASSERT(number != 0);
  using WireType = internal::WireFormatLite::WireType;
  switch (tag & 7) {
    case WireType::WIRETYPE_VARINT: {
      uint64_t value;
      ptr = VarintParse(ptr, &value);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      field_parser.AddVarint(number, value);
      break;
    }
    case WireType::WIRETYPE_FIXED64: {
      uint64_t value = UnalignedLoad<uint64_t>(ptr);
      ptr += 8;
      field_parser.AddFixed64(number, value);
      break;
    }
    case WireType::WIRETYPE_LENGTH_DELIMITED: {
      ptr = field_parser.ParseLengthDelimited(number, ptr, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      break;
    }
    case WireType::WIRETYPE_START_GROUP: {
      ptr = field_parser.ParseGroup(number, ptr, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      break;
    }
    case WireType::WIRETYPE_END_GROUP: {
      GOOGLE_LOG(FATAL) << "Can't happen";
      break;
    }
    case WireType::WIRETYPE_FIXED32: {
      uint32_t value = UnalignedLoad<uint32_t>(ptr);
      ptr += 4;
      field_parser.AddFixed32(number, value);
      break;
    }
    default:
      return nullptr;
  }
  return ptr;
}